

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5AppendPoslist(Fts5Index *p,i64 iDelta,Fts5Iter *pMulti,Fts5Buffer *pBuf)

{
  u8 *puVar1;
  int iVar2;
  int iVar3;
  u32 nByte;
  long lVar4;
  size_t __n;
  
  if (p->rc != 0) {
    return;
  }
  iVar2 = (pMulti->base).nData;
  __n = (size_t)iVar2;
  iVar3 = pBuf->n;
  nByte = iVar2 + iVar3 + 0x1a;
  if ((uint)pBuf->nSpace < nByte) {
    iVar2 = sqlite3Fts5BufferSize(&p->rc,pBuf,nByte);
    if (iVar2 != 0) {
      return;
    }
    iVar3 = pBuf->n;
  }
  iVar2 = sqlite3Fts5PutVarint(pBuf->p + iVar3,iDelta);
  lVar4 = (long)iVar2 + (long)pBuf->n;
  pBuf->n = (int)lVar4;
  iVar2 = sqlite3Fts5PutVarint(pBuf->p + lVar4,__n * 2);
  lVar4 = (long)iVar2 + (long)pBuf->n;
  pBuf->n = (int)lVar4;
  memcpy(pBuf->p + lVar4,(pMulti->base).pData,__n);
  lVar4 = (long)pBuf->n + __n;
  pBuf->n = (int)lVar4;
  puVar1 = pBuf->p + lVar4;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  return;
}

Assistant:

static void fts5AppendPoslist(
  Fts5Index *p,
  i64 iDelta,
  Fts5Iter *pMulti,
  Fts5Buffer *pBuf
){
  int nData = pMulti->base.nData;
  int nByte = nData + 9 + 9 + FTS5_DATA_ZERO_PADDING;
  assert( nData>0 );
  if( p->rc==SQLITE_OK && 0==fts5BufferGrow(&p->rc, pBuf, nByte) ){
    fts5BufferSafeAppendVarint(pBuf, iDelta);
    fts5BufferSafeAppendVarint(pBuf, nData*2);
    fts5BufferSafeAppendBlob(pBuf, pMulti->base.pData, nData);
    memset(&pBuf->p[pBuf->n], 0, FTS5_DATA_ZERO_PADDING);
  }
}